

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

bool hasLSTMWeightParamOfType(LSTMWeightParams *params,WeightParamType *type)

{
  int iVar1;
  WeightParamType WVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  uint uVar6;
  bool bVar7;
  WeightParams *pWVar8;
  WeightParamType WVar9;
  uint uVar10;
  
  pWVar8 = params->inputgateweightmatrix_;
  if (pWVar8 == (WeightParams *)0x0) {
    pWVar8 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
  }
  iVar1 = (pWVar8->floatvalue_).current_size_;
  sVar3 = ((pWVar8->float16value_).ptr_)->_M_string_length;
  uVar10 = (0 < iVar1) + 1;
  if (sVar3 == 0) {
    uVar10 = (uint)(0 < iVar1);
  }
  sVar4 = ((pWVar8->rawvalue_).ptr_)->_M_string_length;
  sVar5 = ((pWVar8->int8rawvalue_).ptr_)->_M_string_length;
  uVar6 = (uint)(sVar5 == 0);
  uVar10 = (uVar10 - (sVar4 == 0)) + 2;
  WVar9 = UNSPECIFIED;
  if (uVar10 - uVar6 < 2) {
    WVar9 = EMPTY;
    if (uVar10 != uVar6) {
      WVar9 = (uint)(iVar1 < 1);
    }
    if (((((sVar3 == 0) && (iVar1 < 1)) && (uVar10 != uVar6)) &&
        (((sVar4 == 0 ||
          (pWVar8 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
         (WVar9 = QUINT, pWVar8->quantization_ == (QuantizationParams *)0x0)))) &&
       (((sVar5 == 0 ||
         (pWVar8 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
        (WVar9 = QINT, pWVar8->quantization_ == (QuantizationParams *)0x0)))) {
      WVar9 = EMPTY;
    }
  }
  WVar2 = *type;
  if (WVar9 != WVar2) {
    pWVar8 = params->forgetgateweightmatrix_;
    if (pWVar8 == (WeightParams *)0x0) {
      pWVar8 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
    }
    iVar1 = (pWVar8->floatvalue_).current_size_;
    sVar3 = ((pWVar8->float16value_).ptr_)->_M_string_length;
    uVar10 = (0 < iVar1) + 1;
    if (sVar3 == 0) {
      uVar10 = (uint)(0 < iVar1);
    }
    sVar4 = ((pWVar8->rawvalue_).ptr_)->_M_string_length;
    sVar5 = ((pWVar8->int8rawvalue_).ptr_)->_M_string_length;
    uVar6 = (uint)(sVar5 == 0);
    uVar10 = (uVar10 - (sVar4 == 0)) + 2;
    WVar9 = UNSPECIFIED;
    if (uVar10 - uVar6 < 2) {
      WVar9 = EMPTY;
      if (uVar10 != uVar6) {
        WVar9 = (uint)(iVar1 < 1);
      }
      if ((((sVar3 == 0) && (iVar1 < 1)) && (uVar10 != uVar6)) &&
         ((((sVar4 == 0 ||
            (pWVar8 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
           (WVar9 = QUINT, pWVar8->quantization_ == (QuantizationParams *)0x0)) &&
          (((sVar5 == 0 ||
            (pWVar8 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)) ||
           (WVar9 = QINT, pWVar8->quantization_ == (QuantizationParams *)0x0)))))) {
        WVar9 = EMPTY;
      }
    }
    if (WVar9 != WVar2) {
      pWVar8 = params->blockinputweightmatrix_;
      if (pWVar8 == (WeightParams *)0x0) {
        pWVar8 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
      }
      iVar1 = (pWVar8->floatvalue_).current_size_;
      sVar3 = ((pWVar8->float16value_).ptr_)->_M_string_length;
      uVar10 = (0 < iVar1) + 1;
      if (sVar3 == 0) {
        uVar10 = (uint)(0 < iVar1);
      }
      sVar4 = ((pWVar8->rawvalue_).ptr_)->_M_string_length;
      sVar5 = ((pWVar8->int8rawvalue_).ptr_)->_M_string_length;
      uVar6 = (uint)(sVar5 == 0);
      uVar10 = (uVar10 - (sVar4 == 0)) + 2;
      WVar9 = UNSPECIFIED;
      if (uVar10 - uVar6 < 2) {
        WVar9 = EMPTY;
        if (uVar10 != uVar6) {
          WVar9 = (uint)(iVar1 < 1);
        }
        if ((((sVar3 == 0) && (iVar1 < 1)) && (uVar10 != uVar6)) &&
           ((((sVar4 == 0 ||
              (pWVar8 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_))
             || (WVar9 = QUINT, pWVar8->quantization_ == (QuantizationParams *)0x0)) &&
            (((sVar5 == 0 ||
              (pWVar8 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_))
             || (WVar9 = QINT, pWVar8->quantization_ == (QuantizationParams *)0x0)))))) {
          WVar9 = EMPTY;
        }
      }
      if (WVar9 != WVar2) {
        pWVar8 = params->outputgateweightmatrix_;
        if (pWVar8 == (WeightParams *)0x0) {
          pWVar8 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
        }
        iVar1 = (pWVar8->floatvalue_).current_size_;
        sVar3 = ((pWVar8->float16value_).ptr_)->_M_string_length;
        uVar10 = (0 < iVar1) + 1;
        if (sVar3 == 0) {
          uVar10 = (uint)(0 < iVar1);
        }
        sVar4 = ((pWVar8->rawvalue_).ptr_)->_M_string_length;
        sVar5 = ((pWVar8->int8rawvalue_).ptr_)->_M_string_length;
        uVar6 = (uint)(sVar5 == 0);
        uVar10 = (uVar10 - (sVar4 == 0)) + 2;
        WVar9 = UNSPECIFIED;
        if (uVar10 - uVar6 < 2) {
          WVar9 = EMPTY;
          if (uVar10 != uVar6) {
            WVar9 = (uint)(iVar1 < 1);
          }
          if (((((sVar3 == 0) && (iVar1 < 1)) && (uVar10 != uVar6)) &&
              (((sVar4 == 0 ||
                (pWVar8 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_))
               || (WVar9 = QUINT, pWVar8->quantization_ == (QuantizationParams *)0x0)))) &&
             (((sVar5 == 0 ||
               (pWVar8 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_))
              || (WVar9 = QINT, pWVar8->quantization_ == (QuantizationParams *)0x0)))) {
            WVar9 = EMPTY;
          }
        }
        if (WVar9 != WVar2) {
          pWVar8 = params->inputgaterecursionmatrix_;
          if (pWVar8 == (WeightParams *)0x0) {
            pWVar8 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
          }
          iVar1 = (pWVar8->floatvalue_).current_size_;
          sVar3 = ((pWVar8->float16value_).ptr_)->_M_string_length;
          uVar10 = (0 < iVar1) + 1;
          if (sVar3 == 0) {
            uVar10 = (uint)(0 < iVar1);
          }
          sVar4 = ((pWVar8->rawvalue_).ptr_)->_M_string_length;
          sVar5 = ((pWVar8->int8rawvalue_).ptr_)->_M_string_length;
          uVar6 = (uint)(sVar5 == 0);
          uVar10 = (uVar10 - (sVar4 == 0)) + 2;
          WVar9 = UNSPECIFIED;
          if (uVar10 - uVar6 < 2) {
            WVar9 = EMPTY;
            if (uVar10 != uVar6) {
              WVar9 = (uint)(iVar1 < 1);
            }
            if (((((sVar3 == 0) && (iVar1 < 1)) && (uVar10 != uVar6)) &&
                (((sVar4 == 0 ||
                  (pWVar8 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_
                  )) || (WVar9 = QUINT, pWVar8->quantization_ == (QuantizationParams *)0x0)))) &&
               (((sVar5 == 0 ||
                 (pWVar8 == (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_)
                 ) || (WVar9 = QINT, pWVar8->quantization_ == (QuantizationParams *)0x0)))) {
              WVar9 = EMPTY;
            }
          }
          if (WVar9 != WVar2) {
            pWVar8 = params->forgetgaterecursionmatrix_;
            if (pWVar8 == (WeightParams *)0x0) {
              pWVar8 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
            }
            iVar1 = (pWVar8->floatvalue_).current_size_;
            sVar3 = ((pWVar8->float16value_).ptr_)->_M_string_length;
            uVar10 = (0 < iVar1) + 1;
            if (sVar3 == 0) {
              uVar10 = (uint)(0 < iVar1);
            }
            sVar4 = ((pWVar8->rawvalue_).ptr_)->_M_string_length;
            sVar5 = ((pWVar8->int8rawvalue_).ptr_)->_M_string_length;
            uVar6 = (uint)(sVar5 == 0);
            uVar10 = (uVar10 - (sVar4 == 0)) + 2;
            WVar9 = UNSPECIFIED;
            if (uVar10 - uVar6 < 2) {
              WVar9 = EMPTY;
              if (uVar10 != uVar6) {
                WVar9 = (uint)(iVar1 < 1);
              }
              if (((((sVar3 == 0) && (iVar1 < 1)) && (uVar10 != uVar6)) &&
                  (((sVar4 == 0 ||
                    (pWVar8 == (WeightParams *)
                               &CoreML::Specification::_WeightParams_default_instance_)) ||
                   (WVar9 = QUINT, pWVar8->quantization_ == (QuantizationParams *)0x0)))) &&
                 (((sVar5 == 0 ||
                   (pWVar8 == (WeightParams *)
                              &CoreML::Specification::_WeightParams_default_instance_)) ||
                  (WVar9 = QINT, pWVar8->quantization_ == (QuantizationParams *)0x0)))) {
                WVar9 = EMPTY;
              }
            }
            if (WVar9 != WVar2) {
              pWVar8 = params->blockinputrecursionmatrix_;
              if (pWVar8 == (WeightParams *)0x0) {
                pWVar8 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
              }
              bVar7 = isWeightParamOfType(pWVar8,type);
              if (!bVar7) {
                pWVar8 = params->outputgaterecursionmatrix_;
                if (pWVar8 == (WeightParams *)0x0) {
                  pWVar8 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_;
                }
                bVar7 = isWeightParamOfType(pWVar8,type);
                if (!bVar7) {
                  pWVar8 = params->inputgatebiasvector_;
                  if (pWVar8 == (WeightParams *)0x0) {
                    pWVar8 = (WeightParams *)&CoreML::Specification::_WeightParams_default_instance_
                    ;
                  }
                  bVar7 = isWeightParamOfType(pWVar8,type);
                  if (!bVar7) {
                    pWVar8 = params->forgetgatebiasvector_;
                    if (pWVar8 == (WeightParams *)0x0) {
                      pWVar8 = (WeightParams *)
                               &CoreML::Specification::_WeightParams_default_instance_;
                    }
                    bVar7 = isWeightParamOfType(pWVar8,type);
                    if (!bVar7) {
                      pWVar8 = params->blockinputbiasvector_;
                      if (pWVar8 == (WeightParams *)0x0) {
                        pWVar8 = (WeightParams *)
                                 &CoreML::Specification::_WeightParams_default_instance_;
                      }
                      bVar7 = isWeightParamOfType(pWVar8,type);
                      if (!bVar7) {
                        pWVar8 = params->outputgatebiasvector_;
                        if (pWVar8 == (WeightParams *)0x0) {
                          pWVar8 = (WeightParams *)
                                   &CoreML::Specification::_WeightParams_default_instance_;
                        }
                        bVar7 = isWeightParamOfType(pWVar8,type);
                        if (!bVar7) {
                          pWVar8 = params->inputgatepeepholevector_;
                          if (pWVar8 == (WeightParams *)0x0) {
                            pWVar8 = (WeightParams *)
                                     &CoreML::Specification::_WeightParams_default_instance_;
                          }
                          bVar7 = isWeightParamOfType(pWVar8,type);
                          if (!bVar7) {
                            pWVar8 = params->forgetgatepeepholevector_;
                            if (pWVar8 == (WeightParams *)0x0) {
                              pWVar8 = (WeightParams *)
                                       &CoreML::Specification::_WeightParams_default_instance_;
                            }
                            bVar7 = isWeightParamOfType(pWVar8,type);
                            if (!bVar7) {
                              pWVar8 = params->outputgatepeepholevector_;
                              if (pWVar8 == (WeightParams *)0x0) {
                                pWVar8 = (WeightParams *)
                                         &CoreML::Specification::_WeightParams_default_instance_;
                              }
                              bVar7 = isWeightParamOfType(pWVar8,type);
                              return bVar7;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

static bool hasLSTMWeightParamOfType(const Specification::LSTMWeightParams& params,
                                               const WeightParamType& type) {

    return (isWeightParamOfType(params.inputgateweightmatrix(), type) ||
            isWeightParamOfType(params.forgetgateweightmatrix(), type) ||
            isWeightParamOfType(params.blockinputweightmatrix(), type) ||
            isWeightParamOfType(params.outputgateweightmatrix(), type) ||

            isWeightParamOfType(params.inputgaterecursionmatrix(), type) ||
            isWeightParamOfType(params.forgetgaterecursionmatrix(), type) ||
            isWeightParamOfType(params.blockinputrecursionmatrix(), type) ||
            isWeightParamOfType(params.outputgaterecursionmatrix(), type) ||

            isWeightParamOfType(params.inputgatebiasvector(), type) ||
            isWeightParamOfType(params.forgetgatebiasvector(), type) ||
            isWeightParamOfType(params.blockinputbiasvector(), type) ||
            isWeightParamOfType(params.outputgatebiasvector(), type) ||

            isWeightParamOfType(params.inputgatepeepholevector(), type) ||
            isWeightParamOfType(params.forgetgatepeepholevector(), type) ||
            isWeightParamOfType(params.outputgatepeepholevector(), type));
}